

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_flip_inplace(void **param_1)

{
  roaring64_bitmap_t *prVar1;
  roaring64_bitmap_t *step;
  roaring64_bitmap_t *expression;
  uint64_t in_RDI;
  roaring64_bitmap_t *r2_2;
  roaring64_bitmap_t *r1_3;
  roaring64_bitmap_t *r2_1;
  roaring64_bitmap_t *r1_2;
  roaring64_bitmap_t *r2;
  roaring64_bitmap_t *r1_1;
  roaring64_bitmap_t *r1;
  uint64_t in_stack_00000078;
  uint64_t in_stack_00000080;
  roaring64_bitmap_t *in_stack_00000088;
  roaring64_bitmap_t *in_stack_000000f0;
  roaring64_bitmap_t *in_stack_000000f8;
  uint64_t in_stack_ffffffffffffff98;
  int line;
  roaring64_bitmap_t *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  roaring64_bitmap_t *in_stack_ffffffffffffffb0;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffc0;
  
  prVar1 = roaring64_bitmap_create();
  roaring64_bitmap_flip_inplace(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x107a77);
  assert_r64_valid((roaring64_bitmap_t *)in_stack_ffffffffffffffa0);
  roaring64_bitmap_contains_range(in_stack_00000088,in_stack_00000080,in_stack_00000078);
  _assert_true((unsigned_long)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (char *)in_stack_ffffffffffffffa0,(int)(in_stack_ffffffffffffff98 >> 0x20));
  roaring64_bitmap_free((roaring64_bitmap_t *)r1_2);
  step = test_flip_inplace::anon_class_1_0_00000001::operator()
                   ((anon_class_1_0_00000001 *)in_stack_ffffffffffffffb0);
  roaring64_bitmap_flip_inplace(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x107ae1);
  test_flip_inplace::anon_class_1_0_00000001::operator()(in_stack_ffffffffffffffc0);
  assert_r64_valid((roaring64_bitmap_t *)in_stack_ffffffffffffffa0);
  roaring64_bitmap_equals(in_stack_000000f8,in_stack_000000f0);
  _assert_true((unsigned_long)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (char *)in_stack_ffffffffffffffa0,(int)(in_stack_ffffffffffffff98 >> 0x20));
  roaring64_bitmap_free((roaring64_bitmap_t *)r1_2);
  roaring64_bitmap_free((roaring64_bitmap_t *)r1_2);
  test_flip_inplace::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffffb0);
  roaring64_bitmap_flip_inplace(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x107b5d);
  test_flip_inplace::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)in_stack_ffffffffffffffb0);
  assert_r64_valid((roaring64_bitmap_t *)in_stack_ffffffffffffffa0);
  roaring64_bitmap_equals(in_stack_000000f8,in_stack_000000f0);
  _assert_true((unsigned_long)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (char *)in_stack_ffffffffffffffa0,(int)(in_stack_ffffffffffffff98 >> 0x20));
  roaring64_bitmap_free((roaring64_bitmap_t *)r1_2);
  roaring64_bitmap_free((roaring64_bitmap_t *)r1_2);
  expression = test_flip_inplace::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)in_stack_ffffffffffffffb0);
  roaring64_bitmap_flip_inplace(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x107bdb);
  prVar1 = roaring64_bitmap_from_range(in_RDI,(uint64_t)prVar1,(uint64_t)step);
  line = (int)((ulong)prVar1 >> 0x20);
  roaring64_bitmap_remove(in_stack_ffffffffffffffb0,(uint64_t)expression);
  assert_r64_valid((roaring64_bitmap_t *)in_stack_ffffffffffffffa0);
  roaring64_bitmap_equals(in_stack_000000f8,in_stack_000000f0);
  _assert_true((unsigned_long)in_stack_ffffffffffffffb0,(char *)expression,
               (char *)in_stack_ffffffffffffffa0,line);
  roaring64_bitmap_free((roaring64_bitmap_t *)r1_2);
  roaring64_bitmap_free((roaring64_bitmap_t *)r1_2);
  return;
}

Assistant:

DEFINE_TEST(test_flip_inplace) {
    {
        // Flipping an empty bitmap should result in a non-empty range.
        roaring64_bitmap_t* r1 = roaring64_bitmap_create();
        roaring64_bitmap_flip_inplace(r1, 10, 100000);
        assert_r64_valid(r1);
        assert_true(roaring64_bitmap_contains_range(r1, 10, 100000));

        roaring64_bitmap_free(r1);
    }
    {
        // Only the specified range should be flipped.
        roaring64_bitmap_t* r1 = roaring64_bitmap_from(1, 3, 6);
        roaring64_bitmap_flip_inplace(r1, 2, 5);
        roaring64_bitmap_t* r2 = roaring64_bitmap_from(1, 2, 4, 6);
        assert_r64_valid(r1);
        assert_true(roaring64_bitmap_equals(r1, r2));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
    }
    {
        // An empty range does nothing.
        roaring64_bitmap_t* r1 = roaring64_bitmap_from(1, 3, 6);
        roaring64_bitmap_flip_inplace(r1, 3, 3);
        roaring64_bitmap_t* r2 = roaring64_bitmap_from(1, 3, 6);
        assert_r64_valid(r1);
        assert_true(roaring64_bitmap_equals(r1, r2));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
    }
    {
        // A bitmap with values in all affected containers.
        roaring64_bitmap_t* r1 =
            roaring64_bitmap_from((2 << 16), (3 << 16) + 1, (4 << 16) + 3);
        roaring64_bitmap_flip_inplace(r1, (2 << 16), (4 << 16) + 4);
        roaring64_bitmap_t* r2 =
            roaring64_bitmap_from_range((2 << 16) + 1, (4 << 16) + 3, 1);
        roaring64_bitmap_remove(r2, (3 << 16) + 1);
        assert_r64_valid(r1);
        assert_true(roaring64_bitmap_equals(r1, r2));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
    }
}